

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

void __thiscall glcts::TestCaseBase::initGLSLSpecializationMap(TestCaseBase *this)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  RenderContext *pRVar4;
  allocator<char> local_811;
  key_type local_810;
  allocator<char> local_7e9;
  key_type local_7e8;
  allocator<char> local_7c1;
  key_type local_7c0;
  allocator<char> local_799;
  key_type local_798;
  allocator<char> local_771;
  key_type local_770;
  allocator<char> local_749;
  key_type local_748;
  allocator<char> local_721;
  key_type local_720;
  allocator<char> local_6f9;
  key_type local_6f8;
  allocator<char> local_6d1;
  key_type local_6d0;
  allocator<char> local_6a9;
  key_type local_6a8;
  allocator<char> local_681;
  key_type local_680;
  allocator<char> local_659;
  key_type local_658;
  allocator<char> local_631;
  key_type local_630;
  allocator<char> local_609;
  key_type local_608;
  ApiType local_5e8;
  allocator<char> local_5e1;
  key_type local_5e0;
  string local_5c0;
  allocator<char> local_599;
  key_type local_598;
  string local_578;
  allocator<char> local_551;
  key_type local_550;
  string local_530;
  allocator<char> local_509;
  key_type local_508;
  string local_4e8;
  allocator<char> local_4c1;
  key_type local_4c0;
  string local_4a0;
  allocator<char> local_479;
  key_type local_478;
  string local_458;
  allocator<char> local_431;
  key_type local_430;
  string local_410;
  allocator<char> local_3e9;
  key_type local_3e8;
  string local_3c8;
  allocator<char> local_3a1;
  key_type local_3a0;
  string local_380;
  allocator<char> local_359;
  key_type local_358;
  string local_338;
  allocator<char> local_311;
  key_type local_310;
  string local_2f0;
  allocator<char> local_2c9;
  key_type local_2c8;
  string local_2a8;
  allocator<char> local_281;
  key_type local_280;
  string local_260;
  allocator<char> local_239;
  key_type local_238;
  string local_218;
  allocator<char> local_1f1;
  key_type local_1f0;
  string local_1d0;
  allocator<char> local_1a9;
  key_type local_1a8;
  string local_188;
  allocator<char> local_161;
  key_type local_160;
  string local_140;
  allocator<char> local_119;
  key_type local_118;
  string local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  string local_b0;
  allocator<char> local_89;
  key_type local_88;
  string local_68;
  allocator<char> local_31;
  key_type local_30;
  TestCaseBase *local_10;
  TestCaseBase *this_local;
  
  local_10 = this;
  pcVar2 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"VERSION",&local_31);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_30);
  std::__cxx11::string::operator=((string *)pmVar3,pcVar2);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  getGLSLExtDirective_abi_cxx11_
            (&local_68,this,this->m_extType,EXTENSIONNAME_SHADER_IO_BLOCKS,EXTENSIONBEHAVIOR_ENABLE)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"SHADER_IO_BLOCKS_ENABLE",&local_89);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_88);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  getGLSLExtDirective_abi_cxx11_
            (&local_b0,this,this->m_extType,EXTENSIONNAME_SHADER_IO_BLOCKS,EXTENSIONBEHAVIOR_REQUIRE
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"SHADER_IO_BLOCKS_REQUIRE",&local_d1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_b0);
  getGLSLExtDirective_abi_cxx11_
            (&local_f8,this,this->m_extType,EXTENSIONNAME_GEOMETRY_SHADER,EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"GEOMETRY_SHADER_ENABLE",&local_119);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_118);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f8);
  getGLSLExtDirective_abi_cxx11_
            (&local_140,this,this->m_extType,EXTENSIONNAME_GEOMETRY_SHADER,EXTENSIONBEHAVIOR_REQUIRE
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"GEOMETRY_SHADER_REQUIRE",&local_161);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_160);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_140);
  getGLSLExtDirective_abi_cxx11_
            (&local_188,this,this->m_extType,EXTENSIONNAME_GEOMETRY_POINT_SIZE,
             EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"GEOMETRY_POINT_SIZE_ENABLE",&local_1a9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_1a8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_188);
  getGLSLExtDirective_abi_cxx11_
            (&local_1d0,this,this->m_extType,EXTENSIONNAME_GEOMETRY_POINT_SIZE,
             EXTENSIONBEHAVIOR_REQUIRE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"GEOMETRY_POINT_SIZE_REQUIRE",&local_1f1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_1f0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string((string *)&local_1d0);
  getGLSLExtDirective_abi_cxx11_
            (&local_218,this,this->m_extType,EXTENSIONNAME_TESSELLATION_SHADER,
             EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"TESSELLATION_SHADER_ENABLE",&local_239);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_238);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_218);
  getGLSLExtDirective_abi_cxx11_
            (&local_260,this,this->m_extType,EXTENSIONNAME_TESSELLATION_SHADER,
             EXTENSIONBEHAVIOR_REQUIRE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"TESSELLATION_SHADER_REQUIRE",&local_281);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_280);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_260);
  getGLSLExtDirective_abi_cxx11_
            (&local_2a8,this,this->m_extType,EXTENSIONNAME_TESSELLATION_POINT_SIZE,
             EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"TESSELLATION_POINT_SIZE_ENABLE",&local_2c9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_2c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a8);
  getGLSLExtDirective_abi_cxx11_
            (&local_2f0,this,this->m_extType,EXTENSIONNAME_TESSELLATION_POINT_SIZE,
             EXTENSIONBEHAVIOR_REQUIRE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"TESSELLATION_POINT_SIZE_REQUIRE",&local_311);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_310);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2f0);
  getGLSLExtDirective_abi_cxx11_
            (&local_338,this,this->m_extType,EXTENSIONNAME_GPU_SHADER5,EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"GPU_SHADER5_ENABLE",&local_359);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_358);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  std::__cxx11::string::~string((string *)&local_338);
  getGLSLExtDirective_abi_cxx11_
            (&local_380,this,this->m_extType,EXTENSIONNAME_GPU_SHADER5,EXTENSIONBEHAVIOR_REQUIRE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"GPU_SHADER5_REQUIRE",&local_3a1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_3a0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string((string *)&local_380);
  getGLSLExtDirective_abi_cxx11_
            (&local_3c8,this,this->m_extType,EXTENSIONNAME_TEXTURE_BUFFER,EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"TEXTURE_BUFFER_ENABLE",&local_3e9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_3e8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c8);
  getGLSLExtDirective_abi_cxx11_
            (&local_410,this,this->m_extType,EXTENSIONNAME_TEXTURE_BUFFER,EXTENSIONBEHAVIOR_REQUIRE)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"TEXTURE_BUFFER_REQUIRE",&local_431);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_430);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_410);
  getGLSLExtDirective_abi_cxx11_
            (&local_458,this,this->m_extType,EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY,
             EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"TEXTURE_CUBE_MAP_ARRAY_ENABLE",&local_479);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_478);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_458);
  getGLSLExtDirective_abi_cxx11_
            (&local_4a0,this,this->m_extType,EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY,
             EXTENSIONBEHAVIOR_REQUIRE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"TEXTURE_CUBE_MAP_ARRAY_REQUIRE",&local_4c1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_4c0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::__cxx11::string::~string((string *)&local_4a0);
  getGLSLExtDirective_abi_cxx11_
            (&local_4e8,this,this->m_extType,EXTENSIONNAME_SHADER_IMAGE_ATOMIC,
             EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"SHADER_IMAGE_ATOMIC_ENABLE",&local_509);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_508);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::__cxx11::string::~string((string *)&local_4e8);
  getGLSLExtDirective_abi_cxx11_
            (&local_530,this,this->m_extType,EXTENSIONNAME_SHADER_IMAGE_ATOMIC,
             EXTENSIONBEHAVIOR_REQUIRE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"SHADER_IMAGE_ATOMIC_REQUIRE",&local_551);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_550);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_530);
  getGLSLExtDirective_abi_cxx11_
            (&local_578,this,this->m_extType,EXTENSIONNAME_VIEWPORT_ARRAY,EXTENSIONBEHAVIOR_ENABLE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"VIEWPORT_ARRAY_ENABLE",&local_599);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_598);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string((string *)&local_578);
  getGLSLExtDirective_abi_cxx11_
            (&local_5c0,this,this->m_extType,EXTENSIONNAME_VIEWPORT_ARRAY,EXTENSIONBEHAVIOR_REQUIRE)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"VIEWPORT_ARRAY_REQUIRE",&local_5e1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->m_specializationMap,&local_5e0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5c0);
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  local_5e8.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES((ContextType)local_5e8.m_bits);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"OUT_PER_VERTEX_DECL",&local_609);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_608);
    std::__cxx11::string::operator=((string *)pmVar3,"\n");
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"IN_PER_VERTEX_DECL",&local_631);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_630);
    std::__cxx11::string::operator=((string *)pmVar3,"\n");
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_658,"OUT_PER_VERTEX_DECL_POINT_SIZE",&local_659);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_658);
    std::__cxx11::string::operator=((string *)pmVar3,"\n");
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator(&local_659);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,"IN_PER_VERTEX_DECL_POINT_SIZE",&local_681);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_680);
    std::__cxx11::string::operator=((string *)pmVar3,"\n");
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator(&local_681);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"IN_DATA_DECL",&local_6a9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_6a8);
    std::__cxx11::string::operator=((string *)pmVar3,"\n");
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator(&local_6a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,"POSITION_WITH_IN_DATA",&local_6d1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_6d0);
    std::__cxx11::string::operator=((string *)pmVar3,"gl_Position = gl_in[0].gl_Position;\n");
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"OUT_PER_VERTEX_TCS_DECL",&local_6f9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_6f8);
    std::__cxx11::string::operator=((string *)pmVar3,"\n");
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"OUT_PER_VERTEX_DECL",&local_721);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_720);
    std::__cxx11::string::operator=
              ((string *)pmVar3,"out gl_PerVertex {\n    vec4 gl_Position;\n};\n");
    std::__cxx11::string::~string((string *)&local_720);
    std::allocator<char>::~allocator(&local_721);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_748,"IN_PER_VERTEX_DECL",&local_749);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_748);
    std::__cxx11::string::operator=
              ((string *)pmVar3,"in  gl_PerVertex { vec4 gl_Position; } gl_in[];\n");
    std::__cxx11::string::~string((string *)&local_748);
    std::allocator<char>::~allocator(&local_749);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_770,"OUT_PER_VERTEX_DECL_POINT_SIZE",&local_771);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_770);
    std::__cxx11::string::operator=
              ((string *)pmVar3,
               "out gl_PerVertex { vec4 gl_Position; float gl_PointSize;} gl_out[];\n");
    std::__cxx11::string::~string((string *)&local_770);
    std::allocator<char>::~allocator(&local_771);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_798,"IN_PER_VERTEX_DECL_POINT_SIZE",&local_799);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_798);
    std::__cxx11::string::operator=
              ((string *)pmVar3,
               "in  gl_PerVertex { vec4 gl_Position; float gl_PointSize;} gl_in[]\n");
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator(&local_799);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c0,"IN_DATA_DECL",&local_7c1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_7c0);
    std::__cxx11::string::operator=((string *)pmVar3,"in Data {\n    vec4 pos;\n} input_data[1];\n")
    ;
    std::__cxx11::string::~string((string *)&local_7c0);
    std::allocator<char>::~allocator(&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e8,"POSITION_WITH_IN_DATA",&local_7e9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_7e8);
    std::__cxx11::string::operator=((string *)pmVar3,"gl_Position = input_data[0].pos;\n");
    std::__cxx11::string::~string((string *)&local_7e8);
    std::allocator<char>::~allocator(&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_810,"OUT_PER_VERTEX_TCS_DECL",&local_811);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_specializationMap,&local_810);
    std::__cxx11::string::operator=
              ((string *)pmVar3,"out gl_PerVertex {\n    vec4 gl_Position;\n} gl_out[];\n");
    std::__cxx11::string::~string((string *)&local_810);
    std::allocator<char>::~allocator(&local_811);
  }
  return;
}

Assistant:

void TestCaseBase::initGLSLSpecializationMap()
{
	m_specializationMap["VERSION"] = glu::getGLSLVersionDeclaration(m_glslVersion);
	m_specializationMap["SHADER_IO_BLOCKS_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_SHADER_IO_BLOCKS, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["SHADER_IO_BLOCKS_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_SHADER_IO_BLOCKS, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["GEOMETRY_SHADER_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_GEOMETRY_SHADER, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["GEOMETRY_SHADER_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_GEOMETRY_SHADER, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["GEOMETRY_POINT_SIZE_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_GEOMETRY_POINT_SIZE, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["GEOMETRY_POINT_SIZE_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_GEOMETRY_POINT_SIZE, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["TESSELLATION_SHADER_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TESSELLATION_SHADER, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["TESSELLATION_SHADER_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TESSELLATION_SHADER, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["TESSELLATION_POINT_SIZE_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TESSELLATION_POINT_SIZE, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["TESSELLATION_POINT_SIZE_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TESSELLATION_POINT_SIZE, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["GPU_SHADER5_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_GPU_SHADER5, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["GPU_SHADER5_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_GPU_SHADER5, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["TEXTURE_BUFFER_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TEXTURE_BUFFER, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["TEXTURE_BUFFER_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TEXTURE_BUFFER, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["TEXTURE_CUBE_MAP_ARRAY_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["TEXTURE_CUBE_MAP_ARRAY_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["SHADER_IMAGE_ATOMIC_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_SHADER_IMAGE_ATOMIC, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["SHADER_IMAGE_ATOMIC_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_SHADER_IMAGE_ATOMIC, EXTENSIONBEHAVIOR_REQUIRE);
	m_specializationMap["VIEWPORT_ARRAY_ENABLE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_VIEWPORT_ARRAY, EXTENSIONBEHAVIOR_ENABLE);
	m_specializationMap["VIEWPORT_ARRAY_REQUIRE"] =
		getGLSLExtDirective(m_extType, EXTENSIONNAME_VIEWPORT_ARRAY, EXTENSIONBEHAVIOR_REQUIRE);

	if (glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		m_specializationMap["OUT_PER_VERTEX_DECL"]			  = "\n";
		m_specializationMap["IN_PER_VERTEX_DECL"]			  = "\n";
		m_specializationMap["OUT_PER_VERTEX_DECL_POINT_SIZE"] = "\n";
		m_specializationMap["IN_PER_VERTEX_DECL_POINT_SIZE"]  = "\n";
		m_specializationMap["IN_DATA_DECL"]					  = "\n";
		m_specializationMap["POSITION_WITH_IN_DATA"]		  = "gl_Position = gl_in[0].gl_Position;\n";
		m_specializationMap["OUT_PER_VERTEX_TCS_DECL"]		  = "\n";
	}
	else
	{
		m_specializationMap["OUT_PER_VERTEX_DECL"] = "out gl_PerVertex {\n"
													 "    vec4 gl_Position;\n"
													 "};\n";
		m_specializationMap["IN_PER_VERTEX_DECL"] = "in  gl_PerVertex { vec4 gl_Position; } gl_in[];\n";
		m_specializationMap["OUT_PER_VERTEX_DECL_POINT_SIZE"] =
			"out gl_PerVertex { vec4 gl_Position; float gl_PointSize;} gl_out[];\n";
		m_specializationMap["IN_PER_VERTEX_DECL_POINT_SIZE"] =
			"in  gl_PerVertex { vec4 gl_Position; float gl_PointSize;} gl_in[]\n";
		m_specializationMap["IN_DATA_DECL"] = "in Data {\n"
											  "    vec4 pos;\n"
											  "} input_data[1];\n";
		m_specializationMap["POSITION_WITH_IN_DATA"]   = "gl_Position = input_data[0].pos;\n";
		m_specializationMap["OUT_PER_VERTEX_TCS_DECL"] = "out gl_PerVertex {\n"
														 "    vec4 gl_Position;\n"
														 "} gl_out[];\n";
	}
}